

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::PathCalculator::startInit
          (PathCalculator *this,LineBlocker *blocker,
          set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
          *setMinLen)

{
  pointer ppPVar1;
  World *this_00;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *pvVar2;
  mapped_type *pmVar3;
  mapped_type *ppPVar4;
  Point *pPVar5;
  pointer ppPVar6;
  Point *point;
  Point *local_38;
  
  this_00 = world::Train::getWorld(this->train);
  pvVar2 = world::World::getPointList(this_00);
  ppPVar6 = (pvVar2->
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (pvVar2->
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar6 != ppPVar1) {
    do {
      local_38 = *ppPVar6;
      pmVar3 = std::
               map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
               ::operator[](&this->minLen,&local_38);
      *pmVar3 = 0x7fffffff;
      ppPVar4 = std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](&this->ancestors,&local_38);
      *ppPVar4 = (mapped_type)0x0;
      ppPVar6 = ppPVar6 + 1;
    } while (ppPVar6 != ppPVar1);
  }
  pPVar5 = world::Train::getPoint(this->train);
  if (pPVar5 == (Point *)0x0) {
    startOnLine(this,setMinLen);
  }
  else {
    startOnPoint(this,blocker,setMinLen);
  }
  return;
}

Assistant:

void PathCalculator::startInit(LineBlocker &blocker,
                               std::set< std::pair<int, const world::Point *>> &setMinLen)
{
    for (auto point : train->getWorld()->getPointList())
    {
        minLen[point] = INT_MAX;
        ancestors[point] = nullptr;
    }

    if (train->getPoint() != nullptr)
        startOnPoint(blocker, setMinLen);
    else
        startOnLine(setMinLen);



}